

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen-x86_64.c
# Opt level: O3

MIR_reg_t get_arg_reg(MIR_type_t arg_type,size_t *int_arg_num,size_t *fp_arg_num,
                     MIR_insn_code_t *mov_code)

{
  ulong uVar1;
  MIR_reg_t MVar2;
  MIR_insn_code_t MVar3;
  
  if (arg_type == MIR_T_LD) {
    MVar2 = 0xffffffff;
    MVar3 = MIR_LDMOV;
  }
  else if ((arg_type & ~MIR_T_U8) == MIR_T_F) {
    uVar1 = *fp_arg_num;
    MVar2 = 0xffffffff;
    if (uVar1 < 8) {
      MVar2 = (int)uVar1 + 0x10;
    }
    *fp_arg_num = uVar1 + 1;
    MVar3 = (arg_type != MIR_T_F) + MIR_FMOV;
  }
  else {
    uVar1 = *int_arg_num;
    MVar2 = 0xffffffff;
    if (uVar1 < 6) {
      MVar2 = *(MIR_reg_t *)(&DAT_001b1a78 + uVar1 * 4);
    }
    *int_arg_num = uVar1 + 1;
    MVar3 = MIR_MOV;
  }
  *mov_code = MVar3;
  return MVar2;
}

Assistant:

static MIR_reg_t get_arg_reg (MIR_type_t arg_type, size_t *int_arg_num, size_t *fp_arg_num,
                              MIR_insn_code_t *mov_code) {
  MIR_reg_t arg_reg;

  if (arg_type == MIR_T_LD) {
    arg_reg = MIR_NON_VAR;
    *mov_code = MIR_LDMOV;
  } else if (arg_type == MIR_T_F || arg_type == MIR_T_D) {
    arg_reg = get_fp_arg_reg (*fp_arg_num);
    (*fp_arg_num)++;
#ifdef _WIN32
    (*int_arg_num)++; /* arg slot used by fp, skip int register */
#endif
    *mov_code = arg_type == MIR_T_F ? MIR_FMOV : MIR_DMOV;
  } else { /* including RBLK */
    arg_reg = get_int_arg_reg (*int_arg_num);
#ifdef _WIN32
    (*fp_arg_num)++; /* arg slot used by int, skip fp register */
#endif
    (*int_arg_num)++;
    *mov_code = MIR_MOV;
  }
  return arg_reg;
}